

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_ports_linux.cc
# Opt level: O0

string * usb_sysfs_hw_string(string *__return_storage_ptr__,string *sysfs_path)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 local_e8 [8];
  string pid;
  undefined1 local_a8 [8];
  string vid;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string serial_number;
  string *sysfs_path_local;
  
  serial_number.field_2._8_8_ = sysfs_path;
  std::operator+(&local_58,sysfs_path,"/serial");
  read_line((string *)local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  lVar1 = std::__cxx11::string::length();
  if (lVar1 != 0) {
    uVar2 = std::__cxx11::string::c_str();
    format_abi_cxx11_((string *)((long)&vid.field_2 + 8),"SNR=%s",uVar2);
    std::__cxx11::string::operator=((string *)local_38,(string *)(vid.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(vid.field_2._M_local_buf + 8));
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&pid.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 serial_number.field_2._8_8_,"/idVendor");
  read_line((string *)local_a8,(string *)((long)&pid.field_2 + 8));
  std::__cxx11::string::~string((string *)(pid.field_2._M_local_buf + 8));
  std::operator+(&local_108,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 serial_number.field_2._8_8_,"/idProduct");
  read_line((string *)local_e8,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  uVar2 = std::__cxx11::string::c_str();
  uVar3 = std::__cxx11::string::c_str();
  uVar4 = std::__cxx11::string::c_str();
  format_abi_cxx11_(__return_storage_ptr__,"USB VID:PID=%s:%s %s",uVar2,uVar3,uVar4);
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

string
usb_sysfs_hw_string(const string& sysfs_path)
{
    string serial_number = read_line( sysfs_path + "/serial" );

    if( serial_number.length() > 0 )
    {
        serial_number = format( "SNR=%s", serial_number.c_str() );
    }

    string vid = read_line( sysfs_path + "/idVendor" );

    string pid = read_line( sysfs_path + "/idProduct" );

    return format("USB VID:PID=%s:%s %s", vid.c_str(), pid.c_str(), serial_number.c_str() );
}